

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O2

LPCSTR __thiscall NpyArray::SaveNPY(NpyArray *this,string *filename,bool bAppend)

{
  pointer puVar1;
  unsigned_long *puVar2;
  pointer puVar3;
  FILE *__stream;
  char *pcVar4;
  byte bVar5;
  long lVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  shape_t *shape;
  bool _fortranOrder;
  char _type;
  shape_t _shape;
  vector<char,_std::allocator<char>_> header;
  
  _shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  _shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (((int)CONCAT71(in_register_00000011,bAppend) == 0) ||
     (__stream = fopen((filename->_M_dataplus)._M_p,"r+b"), __stream == (FILE *)0x0)) {
    __stream = fopen((filename->_M_dataplus)._M_p,"wb");
    shape = &this->shape;
LAB_001227d0:
    if (__stream == (FILE *)0x0) {
      pcVar4 = "error: unable to open file";
    }
    else {
      bVar5 = this->type >> 7;
      CreateHeaderNPY(&header,shape,(this->type ^ bVar5) - bVar5,this->wordSize);
      pcVar4 = (LPCSTR)0x0;
      fseek(__stream,0,0);
      fwrite(header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,1,
             (long)header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,__stream);
      fseek(__stream,0,2);
      fwrite(this->data,this->wordSize,this->numValues,__stream);
      fclose(__stream);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&header.super__Vector_base<char,_std::allocator<char>_>);
    }
  }
  else {
    shape = &_shape;
    pcVar4 = ParseHeaderNPY((FILE *)__stream,shape,(size_t *)&header,&_type,&_fortranOrder);
    if (pcVar4 == (LPCSTR)0x0) {
      if ((pointer)this->wordSize ==
          header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        puVar3 = (this->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar6 = (long)(this->shape).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3;
        if (lVar6 == (long)_shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)_shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start) {
          pcVar4 = "error: npy_save attempting to append misshaped data";
          uVar7 = 1;
          do {
            if ((ulong)(lVar6 >> 3) <= uVar7) {
              *_shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start =
                   *_shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start + *puVar3;
              goto LAB_001227d0;
            }
            puVar1 = puVar3 + uVar7;
            puVar2 = _shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar7;
            uVar7 = uVar7 + 1;
          } while (*puVar1 == *puVar2);
        }
        else {
          pcVar4 = "error: npy_save attempting to append mis-dimensioned data";
        }
      }
      else {
        pcVar4 = "error: npy_save word size";
      }
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&_shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return pcVar4;
}

Assistant:

LPCSTR NpyArray::SaveNPY(std::string filename, bool bAppend) const
{
	FILE* fp;
	shape_t _shape;
	const shape_t* pShape;
	if (bAppend && (fp=fopen(filename.c_str(), "r+b")) != NULL) {
		// file exists, append to it; read the header, modify the array size
		char _type;
		size_t _wordSize;
		bool _fortranOrder;
		LPCSTR ret = ParseHeaderNPY(fp, _shape, _wordSize, _type, _fortranOrder);
		if (ret != NULL)
			return ret;
		ASSERT(!_fortranOrder);

		if (wordSize != _wordSize)
			return "error: npy_save word size";
		if (shape.size() != _shape.size())
			return "error: npy_save attempting to append mis-dimensioned data";

		for (size_t i = 1; i < shape.size(); i++) {
			if (shape[i] != _shape[i])
				return "error: npy_save attempting to append misshaped data";
		}
		_shape[0] += shape[0];
		pShape = &_shape;
	} else {
		// create a new file
		fp = fopen(filename.c_str(), "wb");
		pShape = &shape;
	}
	if (!fp)
		return "error: unable to open file";

	const std::vector<char> header = CreateHeaderNPY(*pShape, std::abs(type), wordSize);

	fseek(fp, 0, SEEK_SET);
	fwrite(header.data(), sizeof(char), header.size(), fp);
	fseek(fp, 0, SEEK_END);
	fwrite(Data(), wordSize, numValues, fp);
	fclose(fp);
	return NULL;
}